

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nginx.c
# Opt level: O2

ngx_pid_t ngx_exec_new_binary(ngx_cycle_t *cycle,char **argv)

{
  void ***pppvVar1;
  ngx_log_t *pnVar2;
  int iVar3;
  ngx_pid_t nVar4;
  char **__ptr;
  char **ppcVar5;
  u_char *buf;
  int *piVar6;
  char **e;
  ulong uVar7;
  uint *puVar8;
  ngx_exec_ctx_t local_68;
  ngx_uint_t local_48;
  char **local_40;
  char **local_38;
  
  local_68.path = *argv;
  local_68.name = "new binary process";
  local_48 = 2;
  local_68.argv = argv;
  __ptr = ngx_set_environment(cycle,&local_48);
  nVar4 = -1;
  if (__ptr != (char **)0x0) {
    ppcVar5 = (char **)ngx_alloc((cycle->listening).nelts * 0xc + 8,cycle->log);
    if (ppcVar5 != (char **)0x0) {
      *(undefined2 *)((long)ppcVar5 + 4) = 0x3d58;
      *(undefined4 *)ppcVar5 = 0x4e49474e;
      buf = (u_char *)((long)ppcVar5 + 6);
      puVar8 = (uint *)(cycle->listening).elts;
      local_40 = argv;
      local_38 = ppcVar5;
      for (uVar7 = 0; uVar7 < (cycle->listening).nelts; uVar7 = uVar7 + 1) {
        buf = ngx_sprintf(buf,"%ud;",(ulong)*puVar8);
        puVar8 = puVar8 + 0x38;
      }
      *buf = '\0';
      __ptr[local_48] = (char *)local_38;
      __ptr[local_48 + 1] =
           "SPARE=XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
      ;
      __ptr[local_48 + 2] = (char *)0x0;
      local_48 = local_48 + 2;
      for (ppcVar5 = __ptr; *ppcVar5 != (char *)0x0; ppcVar5 = ppcVar5 + 1) {
        if ((cycle->log->log_level & 0x10) != 0) {
          ngx_log_error_core(8,cycle->log,0,"env: %s");
        }
      }
      pppvVar1 = cycle->conf_ctx[ngx_core_module.index];
      local_68.envp = __ptr;
      iVar3 = rename((char *)pppvVar1[0x13],(char *)pppvVar1[0x15]);
      if (iVar3 == -1) {
        pnVar2 = cycle->log;
        if (1 < pnVar2->log_level) {
          piVar6 = __errno_location();
          ngx_log_error_core(2,pnVar2,*piVar6,
                             "rename() %s to %s failed before executing new binary process \"%s\"",
                             pppvVar1[0x13],pppvVar1[0x15],*local_40);
        }
        free(__ptr);
        free(local_38);
        return -1;
      }
      nVar4 = ngx_execute(cycle,&local_68);
      if (((nVar4 == -1) &&
          (iVar3 = rename((char *)pppvVar1[0x15],(char *)pppvVar1[0x13]), iVar3 == -1)) &&
         (pnVar2 = cycle->log, 1 < pnVar2->log_level)) {
        piVar6 = __errno_location();
        ngx_log_error_core(2,pnVar2,*piVar6,
                           "rename() %s back to %s failed after an attempt to execute new binary process \"%s\""
                           ,pppvVar1[0x15],pppvVar1[0x13],*local_40);
      }
      free(__ptr);
      __ptr = local_38;
    }
    free(__ptr);
  }
  return nVar4;
}

Assistant:

ngx_pid_t
ngx_exec_new_binary(ngx_cycle_t *cycle, char *const *argv)
{
    char             **env, *var;
    u_char            *p;
    ngx_uint_t         i, n;
    ngx_pid_t          pid;
    ngx_exec_ctx_t     ctx;
    ngx_core_conf_t   *ccf;
    ngx_listening_t   *ls;

    ngx_memzero(&ctx, sizeof(ngx_exec_ctx_t));

    ctx.path = argv[0];
    ctx.name = "new binary process";
    ctx.argv = argv;

    n = 2;
    env = ngx_set_environment(cycle, &n);
    if (env == NULL) {
        return NGX_INVALID_PID;
    }

    var = ngx_alloc(sizeof(NGINX_VAR)
                    + cycle->listening.nelts * (NGX_INT32_LEN + 1) + 2,
                    cycle->log);
    if (var == NULL) {
        ngx_free(env);
        return NGX_INVALID_PID;
    }

    p = ngx_cpymem(var, NGINX_VAR "=", sizeof(NGINX_VAR));

    ls = cycle->listening.elts;
    for (i = 0; i < cycle->listening.nelts; i++) {
        p = ngx_sprintf(p, "%ud;", ls[i].fd);
    }

    *p = '\0';

    env[n++] = var;

#if (NGX_SETPROCTITLE_USES_ENV)

    /* allocate the spare 300 bytes for the new binary process title */

    env[n++] = "SPARE=XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX";

#endif

    env[n] = NULL;

#if (NGX_DEBUG)
    {
    char  **e;
    for (e = env; *e; e++) {
        ngx_log_debug1(NGX_LOG_DEBUG_CORE, cycle->log, 0, "env: %s", *e);
    }
    }
#endif

    ctx.envp = (char *const *) env;

    ccf = (ngx_core_conf_t *) ngx_get_conf(cycle->conf_ctx, ngx_core_module);

    if (ngx_rename_file(ccf->pid.data, ccf->oldpid.data) == NGX_FILE_ERROR) {
        ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_errno,
                      ngx_rename_file_n " %s to %s failed "
                      "before executing new binary process \"%s\"",
                      ccf->pid.data, ccf->oldpid.data, argv[0]);

        ngx_free(env);
        ngx_free(var);

        return NGX_INVALID_PID;
    }

    pid = ngx_execute(cycle, &ctx);

    if (pid == NGX_INVALID_PID) {
        if (ngx_rename_file(ccf->oldpid.data, ccf->pid.data)
            == NGX_FILE_ERROR)
        {
            ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_errno,
                          ngx_rename_file_n " %s back to %s failed after "
                          "an attempt to execute new binary process \"%s\"",
                          ccf->oldpid.data, ccf->pid.data, argv[0]);
        }
    }

    ngx_free(env);
    ngx_free(var);

    return pid;
}